

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void solver_finished_cb(result *r)

{
  bool bVar1;
  const_reference pvVar2;
  char (*in_RSI) [34];
  long local_18;
  result *local_10;
  result *r_local;
  
  local_10 = r;
  fmt::v7::print<char[17],,char>((v7 *)"Solver finished\n",(char (*) [17])in_RSI);
  switch(local_10->status) {
  case success:
    bVar1 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::empty
                      (&local_10->solutions);
    if (!bVar1) {
      pvVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                         (&local_10->solutions);
      bVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::empty(&pvVar2->variables);
      if (bVar1) {
        pvVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                           (&local_10->solutions);
        fmt::v7::print<char[54],double_const&,double_const&,char>
                  ((char (*) [54])"Best solution found via preprocessor: {:.10g} in {}s\n",
                   &pvVar2->value,&local_10->duration);
      }
      else if (local_10->loop < 0) {
        pvVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                           (&local_10->solutions);
        local_18 = -local_10->loop;
        fmt::v7::print<char[58],double_const&,long,double_const&,char>
                  ((char (*) [58])"Best solution found via push: {:.10g} in {} loop and {}s\n",
                   &pvVar2->value,&local_18,&local_10->duration);
      }
      else {
        pvVar2 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                           (&local_10->solutions);
        fmt::v7::print<char[49],double_const&,long_const&,double_const&,char>
                  ((char (*) [49])"Best solution found: {:.10g} in {} loop and {}s\n",&pvVar2->value
                   ,&local_10->loop,&local_10->duration);
      }
    }
    break;
  case internal_error:
    fmt::v7::print<char[29],,char>((v7 *)"No solution. Internal error\n",(char (*) [29])in_RSI);
    break;
  case uninitialized:
    fmt::v7::print<char[34],,char>((v7 *)"No solution. Uninitialized error\n",in_RSI);
    break;
  case time_limit_reached:
    fmt::v7::print<char[67],int_const&,double_const&,char>
              ((char (*) [67])"No solution. Constraint remaining: {}. Time limit reached at {}s.\n",
               &local_10->remaining_constraints,&local_10->duration);
    break;
  case kappa_max_reached:
    fmt::v7::print<char[62],int_const&,double_const&,char>
              ((char (*) [62])"No solution. Constraint remaining: {}. Kappa reached in {}s.\n",
               &local_10->remaining_constraints,&local_10->duration);
    break;
  case limit_reached:
    fmt::v7::print<char[67],int_const&,double_const&,char>
              ((char (*) [67])"No solution. Constraint remaining: {}. Loop limit reached in {}s.\n",
               &local_10->remaining_constraints,&local_10->duration);
    break;
  case empty_context:
    fmt::v7::print<char[23],,char>((v7 *)"Context uninitialized\n",(char (*) [23])in_RSI);
  }
  return;
}

Assistant:

static void
solver_finished_cb(const baryonyx::result& r)
{
    fmt::print("Solver finished\n");

    switch (r.status) {
    case baryonyx::result_status::success:
        if (!r.solutions.empty()) {
            if (r.solutions.back().variables.empty()) {
                fmt::print(
                  "Best solution found via preprocessor: {:.10g} in {}s\n",
                  r.solutions.back().value,
                  r.duration);
            } else {
                if (r.loop >= 0)
                    fmt::print(
                      "Best solution found: {:.10g} in {} loop and {}s\n",
                      r.solutions.back().value,
                      r.loop,
                      r.duration);
                else
                    fmt::print("Best solution found via push: {:.10g} in {} "
                               "loop and {}s\n",
                               r.solutions.back().value,
                               -r.loop,
                               r.duration);
            }
        }
        break;
    case baryonyx::result_status::internal_error:
        fmt::print("No solution. Internal error\n");
        break;
    case baryonyx::result_status::uninitialized:
        fmt::print("No solution. Uninitialized error\n");
        break;
    case baryonyx::result_status::kappa_max_reached:
        fmt::print(
          "No solution. Constraint remaining: {}. Kappa reached in {}s.\n",
          r.remaining_constraints,
          r.duration);
        break;
    case baryonyx::result_status::time_limit_reached:
        fmt::print("No solution. Constraint remaining: {}. Time limit reached "
                   "at {}s.\n",
                   r.remaining_constraints,
                   r.duration);
        break;
    case baryonyx::result_status::limit_reached:
        fmt::print("No solution. Constraint remaining: {}. Loop limit reached "
                   "in {}s.\n",
                   r.remaining_constraints,
                   r.duration);
        break;
    case baryonyx::result_status::empty_context:
        fmt::print("Context uninitialized\n");
        break;
    }
}